

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:613:13)>
::getImpl(SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:613:13)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::OwnFd> depResult;
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 local_364;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 local_360;
  ExceptionOr<kj::OwnFd> local_358;
  ExceptionOr<kj::Promise<unsigned_long>_> local_1b8;
  
  local_358.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_358.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_358.super_ExceptionOrValue);
  if (local_358.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1b8,
               &local_358.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_1b8.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)output,&local_1b8);
    ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr(&local_1b8);
  }
  else if (local_358.value.ptr.isSet == true) {
    local_364 = local_358.value.ptr.field_1;
    local_358.value.ptr.field_1 = (anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2)0xffffffff
    ;
    anon_class_24_3_98c709d1_for_func::operator()
              ((anon_class_24_3_98c709d1_for_func *)&local_360.value,(OwnFd *)&this->func);
    OwnFd::~OwnFd(&local_364.value);
    local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b8.value.ptr.isSet = true;
    local_1b8.value.ptr.field_1 = local_360;
    local_360 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2)0x0;
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)output,&local_1b8);
    ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr(&local_1b8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360.value);
  }
  ExceptionOr<kj::OwnFd>::~ExceptionOr(&local_358);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }